

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayoutPrivate::calcSizeHints(QFormLayoutPrivate *this)

{
  const_reference pQVar1;
  int *piVar2;
  QFormLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  int spacing;
  int i;
  QFormLayout *q;
  int mw;
  int w;
  int mh;
  int h;
  int bottomMargin;
  int rightMargin;
  int topMargin;
  int leftMargin;
  int in_stack_00000094;
  QFormLayoutPrivate *in_stack_00000098;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar3;
  QList<QLayoutStruct> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int *in_stack_ffffffffffffffa0;
  int *b;
  int *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_3c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  local_c = -0x55555556;
  local_10 = -0x55555556;
  local_14 = -0x55555556;
  local_18 = -0x55555556;
  QLayout::getContentsMargins
            ((QLayout *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (int *)in_stack_ffffffffffffff90);
  updateSizes(_bottomMargin);
  setupVerticalLayoutData(in_stack_00000098,in_stack_00000094);
  local_1c = local_10 + local_18;
  local_20 = local_10 + local_18;
  local_24 = in_RDI->sh_width + local_c + local_14;
  local_28 = in_RDI->min_width + local_c + local_14;
  for (local_3c = 0; local_3c < in_RDI->vLayoutCount; local_3c = local_3c + 1) {
    pQVar1 = QList<QLayoutStruct>::at
                       (in_stack_ffffffffffffff90,
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    iVar3 = pQVar1->spacing;
    pQVar1 = QList<QLayoutStruct>::at
                       (in_stack_ffffffffffffff90,
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_1c = pQVar1->sizeHint + iVar3 + local_1c;
    pQVar1 = QList<QLayoutStruct>::at
                       (in_stack_ffffffffffffff90,
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_20 = pQVar1->minimumSize + iVar3 + local_20;
  }
  b = &QLAYOUTSIZE_MAX;
  piVar2 = qMin<int>(&local_28,&QLAYOUTSIZE_MAX);
  iVar3 = *piVar2;
  piVar2 = QSize::rwidth((QSize *)0x4b52f9);
  *piVar2 = iVar3;
  piVar2 = qMin<int>(&local_20,b);
  iVar3 = *piVar2;
  piVar2 = QSize::rheight((QSize *)0x4b531e);
  *piVar2 = iVar3;
  piVar2 = qMin<int>(&local_24,b);
  iVar3 = *piVar2;
  piVar2 = QSize::rwidth((QSize *)0x4b534f);
  *piVar2 = iVar3;
  piVar2 = qMin<int>(&local_1c,b);
  iVar3 = *piVar2;
  piVar2 = QSize::rheight((QSize *)0x4b5374);
  *piVar2 = iVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFormLayoutPrivate::calcSizeHints()
{
    Q_Q(QFormLayout);

    int leftMargin, topMargin, rightMargin, bottomMargin;
    q->getContentsMargins(&leftMargin, &topMargin, &rightMargin, &bottomMargin);

    updateSizes();
    setupVerticalLayoutData(QLAYOUTSIZE_MAX);
    // Don't need to call setupHorizontal here

    int h = topMargin + bottomMargin;
    int mh = topMargin + bottomMargin;

    // The following are set in updateSizes
    int w = sh_width + leftMargin + rightMargin;
    int mw = min_width + leftMargin + rightMargin;

    for (int i = 0; i < vLayoutCount; ++i) {
        int spacing = vLayouts.at(i).spacing;
        h += vLayouts.at(i).sizeHint + spacing;
        mh += vLayouts.at(i).minimumSize + spacing;
    }

    minSize.rwidth() = qMin(mw, QLAYOUTSIZE_MAX);
    minSize.rheight() = qMin(mh, QLAYOUTSIZE_MAX);
    prefSize.rwidth() = qMin(w, QLAYOUTSIZE_MAX);
    prefSize.rheight() = qMin(h, QLAYOUTSIZE_MAX);
}